

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_reg_write_batch(uc_engine *uc,int *regs,void **vals,int count)

{
  uc_err uVar1;
  undefined8 uStack_60;
  uc_err err;
  size_t size;
  void *value;
  uint regid;
  int i;
  int setpc;
  int mode;
  void *env;
  reg_write_t reg_write;
  int __init_ret;
  int count_local;
  void **vals_local;
  int *regs_local;
  uc_engine *uc_local;
  
  reg_write._4_4_ = count;
  ___init_ret = vals;
  vals_local = (void **)regs;
  regs_local = (int *)uc;
  if (((uc->init_done ^ 0xffU) & 1) != 0) {
    uVar1 = uc_init_engine(uc);
    if (uVar1 != UC_ERR_OK) {
      return uVar1;
    }
    reg_write._0_4_ = 0;
  }
  env = *(void **)(regs_local + 0x24);
  _setpc = *(undefined8 *)(*(long *)(regs_local + 0x68) + 0x128);
  i = regs_local[1];
  regid = 0;
  value._4_4_ = 0;
  while( true ) {
    if (reg_write._4_4_ <= value._4_4_) {
      if (regid != 0) {
        *(undefined1 *)((long)regs_local + 0x556) = 1;
        break_translation_loop((uc_engine *)regs_local);
      }
      return UC_ERR_OK;
    }
    value._0_4_ = *(undefined4 *)((long)vals_local + (long)value._4_4_ * 4);
    size = (size_t)___init_ret[value._4_4_];
    uStack_60 = 0xffffffffffffffff;
    uVar1 = (*(code *)env)(_setpc,i,value._0_4_,size,&stack0xffffffffffffffa0,&regid);
    if (uVar1 != UC_ERR_OK) break;
    value._4_4_ = value._4_4_ + 1;
  }
  return uVar1;
}

Assistant:

UNICORN_EXPORT
uc_err uc_reg_write_batch(uc_engine *uc, int *regs, void *const *vals,
                          int count)
{
    UC_INIT(uc);
    reg_write_t reg_write = uc->reg_write;
    void *env = uc->cpu->env_ptr;
    int mode = uc->mode;
    int setpc = 0;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        const void *value = vals[i];
        size_t size = (size_t)-1;
        uc_err err = reg_write(env, mode, regid, value, &size, &setpc);
        if (err) {
            return err;
        }
    }
    if (setpc) {
        // force to quit execution and flush TB
        uc->quit_request = true;
        break_translation_loop(uc);
    }

    return UC_ERR_OK;
}